

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O2

bool __thiscall tinyusdz::StreamReader::read1(StreamReader *this,char *ret)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = this->length_;
  uVar1 = this->idx_ + 1;
  if (uVar1 <= uVar2) {
    *ret = this->binary_[this->idx_];
    this->idx_ = this->idx_ + 1;
  }
  return uVar1 <= uVar2;
}

Assistant:

bool read1(char *ret) const {
    if ((idx_ + 1) > length_) {
      return false;
    }

    const char val = static_cast<const char>(binary_[idx_]);

    (*ret) = val;
    idx_ += 1;

    return true;
  }